

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  
  pbVar2 = (byte *)this->end_;
  pbVar5 = (byte *)this->current_;
  while (((pbVar5 != pbVar2 && ((ulong)*pbVar5 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
    pbVar5 = pbVar5 + 1;
    this->current_ = (Location)pbVar5;
  }
  token->start_ = (Location)pbVar5;
  if (pbVar5 == pbVar2) {
LAB_005d0875:
    token->type_ = tokenEndOfStream;
    goto LAB_005d08eb;
  }
  pbVar6 = pbVar5 + 1;
  this->current_ = (Location)pbVar6;
  bVar1 = *pbVar5;
  if (0x5a < bVar1) {
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x5b) {
        token->type_ = tokenArrayBegin;
        goto LAB_005d08eb;
      }
      if (bVar1 == 0x5d) {
        token->type_ = tokenArrayEnd;
        goto LAB_005d08eb;
      }
      if ((bVar1 == 0x66) && (token->type_ = tokenFalse, 3 < (long)pbVar2 - (long)pbVar6)) {
        lVar8 = 4;
        do {
          if (lVar8 == 0) {
            pbVar5 = pbVar5 + 5;
            goto LAB_005d0922;
          }
          pbVar2 = pbVar5 + lVar8;
          pbVar6 = (byte *)("False" + lVar8);
          lVar8 = lVar8 + -1;
        } while (*pbVar2 == *pbVar6);
      }
    }
    else if (bVar1 < 0x7b) {
      if (bVar1 == 0x6e) {
        token->type_ = tokenNull;
        if (2 < (long)pbVar2 - (long)pbVar6) {
          lVar8 = 3;
          do {
            if (lVar8 == 0) goto LAB_005d0918;
            pbVar2 = pbVar5 + lVar8;
            lVar3 = lVar8 + 7;
            lVar8 = lVar8 + -1;
          } while (*pbVar2 == "--help-full"[lVar3]);
        }
      }
      else if ((bVar1 == 0x74) && (token->type_ = tokenTrue, 2 < (long)pbVar2 - (long)pbVar6)) {
        lVar8 = 3;
        do {
          if (lVar8 == 0) goto LAB_005d0918;
          pbVar2 = pbVar5 + lVar8;
          pbVar6 = (byte *)("True" + lVar8);
          lVar8 = lVar8 + -1;
        } while (*pbVar2 == *pbVar6);
      }
    }
    else {
      if (bVar1 == 0x7d) {
        token->type_ = tokenObjectEnd;
        goto LAB_005d08eb;
      }
      if (bVar1 == 0x7b) {
        token->type_ = tokenObjectBegin;
        goto LAB_005d08eb;
      }
    }
    goto switchD_005d074d_caseD_23;
  }
  switch(bVar1) {
  case 0x22:
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_005d089b;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_005d08eb;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    while ((pbVar6 != pbVar2 &&
           (((byte)(*pbVar6 - 0x30) < 10 ||
            ((uVar7 = *pbVar6 - 0x2b, uVar7 < 0x3b &&
             ((0x40000000400000dU >> ((ulong)uVar7 & 0x3f) & 1) != 0))))))) {
      pbVar6 = pbVar6 + 1;
      this->current_ = (Location)pbVar6;
    }
    goto LAB_005d08eb;
  case 0x2f:
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_005d089b:
    if (bVar4 != false) goto LAB_005d08eb;
    break;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    goto LAB_005d08eb;
  default:
    if (bVar1 == 0) goto LAB_005d0875;
  }
switchD_005d074d_caseD_23:
  token->type_ = tokenError;
LAB_005d08eb:
  token->end_ = this->current_;
  return true;
LAB_005d0918:
  pbVar5 = pbVar5 + 4;
LAB_005d0922:
  this->current_ = (Location)pbVar5;
  goto LAB_005d08eb;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}